

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<bool> *target,string_view name,
          string_view value)

{
  ushort uVar1;
  ushort uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  string local_38;
  
  local_48 = name._M_str;
  local_40 = name._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = 0x100;
  uVar2 = 1;
  if (value._M_len != 0) {
    if (value._M_len == 5) {
      if ((value._M_str[4] == 'e' && *(int *)value._M_str == 0x736c6146) ||
         (in_R9._0_4_ = (byte)value._M_str[4] ^ 0x65 | *(uint *)value._M_str ^ 0x736c6166,
         in_R9._4_4_ = 0, in_R9._0_4_ == 0)) {
        uVar2 = 0;
        goto LAB_002a1fa1;
      }
    }
    else if ((value._M_len == 4) &&
            ((*(int *)value._M_str == 0x65757254 || (*(int *)value._M_str == 0x65757274))))
    goto LAB_002a1fa1;
    local_58 = value._M_str;
    local_50 = value._M_len;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x2c;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_38,(v11 *)"invalid value \'{}\' for boolean argument \'{}\'",fmt,args);
    set_abi_cxx11_();
    uVar2 = 0;
    uVar1 = 0;
  }
LAB_002a1fa1:
  (target->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload_base<bool>)(uVar1 | uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<bool>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseBool(name, value, error);
    return error;
}